

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroupCollection::CommitDropColumn(RowGroupCollection *this,idx_t column_index)

{
  bool bVar1;
  RowGroup *column_index_00;
  SegmentIterator SVar2;
  RowGroup *row_group;
  SegmentIterator __end1;
  SegmentIterator __begin1;
  SegmentIterationHelper *__range1;
  SegmentTree<duckdb::RowGroup,_true> *in_stack_ffffffffffffffb8;
  SegmentTree<duckdb::RowGroup,_true> *in_stack_ffffffffffffffc0;
  SegmentIterator local_30;
  SegmentTree<duckdb::RowGroup,_true> *local_20;
  SegmentTree<duckdb::RowGroup,_true> **local_18;
  
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
            ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_ffffffffffffffc0);
  local_20 = (SegmentTree<duckdb::RowGroup,_true> *)
             SegmentTree<duckdb::RowGroup,_true>::Segments(in_stack_ffffffffffffffb8);
  local_18 = &local_20;
  local_30 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin
                       ((SegmentIterationHelper *)in_stack_ffffffffffffffc0);
  SVar2 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::end
                    ((SegmentIterationHelper *)0xbb31f1);
  while( true ) {
    bVar1 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::operator!=
                      (&local_30,(SegmentIterator *)&stack0xffffffffffffffc0);
    if (!bVar1) break;
    column_index_00 =
         SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::operator*
                   (&local_30);
    RowGroup::CommitDropColumn((RowGroup *)SVar2.tree,(idx_t)column_index_00);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::operator++
              ((SegmentIterator *)SVar2.tree);
  }
  return;
}

Assistant:

void RowGroupCollection::CommitDropColumn(const idx_t column_index) {
	for (auto &row_group : row_groups->Segments()) {
		row_group.CommitDropColumn(column_index);
	}
}